

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModulusPoly.cpp
# Opt level: O3

ModulusPoly * __thiscall
ZXing::Pdf417::ModulusPoly::add
          (ModulusPoly *__return_storage_ptr__,ModulusPoly *this,ModulusPoly *other)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  ModulusGF *field;
  invalid_argument *this_00;
  ulong uVar4;
  int *piVar5;
  pointer __src;
  vector<int,_std::allocator<int>_> *__x;
  int iVar6;
  size_t i;
  ulong uVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  vector<int,_std::allocator<int>_> sumDiff;
  allocator_type local_41;
  vector<int,_std::allocator<int>_> local_40;
  
  if (this->_field != other->_field) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"ModulusPolys do not have same ModulusGF field")
    ;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar5 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (this->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != piVar5) {
    if (*piVar5 == 0) {
      __return_storage_ptr__->_field = other->_field;
      __x = &other->_coefficients;
    }
    else {
      piVar2 = (other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (other->_coefficients).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar3 == piVar2) goto LAB_00174632;
      __x = &this->_coefficients;
      if (*piVar2 != 0) {
        pvVar8 = &other->_coefficients;
        if ((ulong)((long)piVar3 - (long)piVar2) < (ulong)((long)piVar1 - (long)piVar5)) {
          pvVar8 = __x;
          __x = &other->_coefficients;
          piVar2 = piVar5;
        }
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_40,
                   (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar2 >> 2,&local_41);
        __src = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
        uVar4 = (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)__src >> 2;
        uVar7 = uVar4 - ((long)(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)(__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start >> 2);
        if (uVar7 != 0) {
          memmove(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,__src,uVar7 * 4);
          __src = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
          uVar4 = (long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)__src >> 2;
        }
        field = this->_field;
        if (uVar7 < uVar4) {
          piVar5 = (__x->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          do {
            iVar6 = field->_modulus;
            if (__src[uVar7] + *piVar5 < iVar6) {
              iVar6 = 0;
            }
            local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar7] = (__src[uVar7] + *piVar5) - iVar6;
            uVar7 = uVar7 + 1;
            piVar5 = piVar5 + 1;
          } while (uVar7 < uVar4);
        }
        ModulusPoly(__return_storage_ptr__,field,&local_40);
        if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == (pointer)0x0) {
          return __return_storage_ptr__;
        }
        operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
        return __return_storage_ptr__;
      }
      __return_storage_ptr__->_field = this->_field;
    }
    std::vector<int,_std::allocator<int>_>::vector(&__return_storage_ptr__->_coefficients,__x);
    return __return_storage_ptr__;
  }
LAB_00174632:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
}

Assistant:

ModulusPoly
ModulusPoly::add(const ModulusPoly& other) const
{
	if (_field != other._field) {
		throw std::invalid_argument("ModulusPolys do not have same ModulusGF field");
	}
	if (isZero()) {
		return other;
	}
	if (other.isZero()) {
		return *this;
	}

	auto smallerCoefficients = &_coefficients;
	auto largerCoefficients = &other._coefficients;
	if (smallerCoefficients->size() > largerCoefficients->size()) {
		std::swap(smallerCoefficients, largerCoefficients);
	}
	std::vector<int> sumDiff(largerCoefficients->size());
	size_t lengthDiff = largerCoefficients->size() - smallerCoefficients->size();

	// Copy high-order terms only found in higher-degree polynomial's coefficients
	std::copy_n(largerCoefficients->begin(), lengthDiff, sumDiff.begin());
	for (size_t i = lengthDiff; i < largerCoefficients->size(); i++) {
		sumDiff[i] = _field->add((*smallerCoefficients)[i - lengthDiff], (*largerCoefficients)[i]);
	}
	return ModulusPoly(*_field, sumDiff);
}